

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double find_split_std_gain_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix,
                 vector<double,_std::allocator<double>_> *w)

{
  float fVar1;
  pointer pdVar2;
  long lVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  longdouble *in_stack_ffffffffffffff40;
  longdouble local_48;
  
  calc_sd_right_to_left_weighted<float,std::vector<double,std::allocator<double>>,long_double>
            ((longdouble *)x,(float *)ix_arr,xmean,(size_t *)st,end,(size_t)sd_arr,(double *)w,
             (vector<double,_std::allocator<double>_> *)&local_48,in_stack_ffffffffffffff40);
  fVar1 = x[ix_arr[st]];
  *split_ix = st;
  if (st < end) {
    dVar10 = (double)in_ST0;
    pdVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = -INFINITY;
    lVar6 = (longdouble)0;
    lVar3 = 0;
    lVar7 = lVar6;
    lVar9 = lVar6;
    lVar8 = (longdouble)(fVar1 - xmean);
    do {
      lVar4 = (longdouble)pdVar2[ix_arr[st + lVar3]];
      lVar6 = lVar6 + lVar4;
      fVar1 = x[ix_arr[st + lVar3]];
      lVar5 = (longdouble)(fVar1 - xmean);
      lVar9 = ((lVar5 - lVar9) * lVar4) / lVar6 + lVar9;
      lVar7 = lVar4 * (lVar5 - lVar9) * (lVar5 - lVar8) + lVar7;
      if ((fVar1 != x[ix_arr[st + lVar3 + 1]]) || (NAN(fVar1) || NAN(x[ix_arr[st + lVar3 + 1]]))) {
        if (lVar3 == 0) {
          dVar11 = 0.0;
        }
        else {
          dVar11 = (double)SQRT(lVar7 / lVar6);
        }
        if (criterion == Pooled) {
          dVar11 = (double)((longdouble)1 +
                           (longdouble)(-1.0 / dVar10) *
                           (((longdouble)(float)lVar6 / local_48) * (longdouble)dVar11 +
                           ((longdouble)(float)(local_48 - lVar6) / local_48) *
                           (longdouble)sd_arr[lVar3 + 1]));
        }
        else {
          dVar11 = 1.0 - (dVar11 + sd_arr[lVar3 + 1]) / (dVar10 + dVar10);
        }
        if ((dVar12 < dVar11) && (min_gain < dVar11)) {
          *split_ix = st + lVar3;
          dVar12 = dVar11;
        }
      }
      lVar3 = lVar3 + 1;
      lVar8 = lVar9;
    } while ((st - end) + lVar3 != 0);
  }
  else {
    dVar12 = -INFINITY;
  }
  if (dVar12 != -INFINITY) {
    dVar10 = midpoint<float>(x[ix_arr[*split_ix]],x[ix_arr[*split_ix + 1]]);
    *split_point = dVar10;
  }
  return dVar12;
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, real_t xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix, mapping &restrict w)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, xmean, ix_arr, st, end, sd_arr, w, cumw);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[ix_arr[st]] - xmean;
    double best_gain = -HUGE_VAL;
    ldouble_safe currw = 0;
    double this_sd, this_gain;
    double w_this;
    split_ix = st;

    for (size_t row = st; row < end; row++)
    {
        w_this = w[ix_arr[row]];
        currw += w_this;
        running_mean   += w_this * ((x[ix_arr[row]] - xmean) - running_mean) / currw;
        running_ssq    += w_this * (((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row-st+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}